

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::print(VirtualMachine *this)

{
  pointer pVVar1;
  Function *pFVar2;
  pointer pBVar3;
  element_type *peVar4;
  pointer pFVar5;
  pointer pOVar6;
  pointer pbVar7;
  char cVar8;
  ostream *poVar9;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  ulong uVar11;
  size_t index;
  pointer pbVar12;
  ulong uVar13;
  element_type *peVar14;
  long lVar15;
  Variable VVar16;
  Variable var;
  Variable var_00;
  ByteCode bc;
  string local_58;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"Stack Frames:\n",0xe);
  for (peVar14 = (this->stackFrame).
                 super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar14 != (element_type *)0x0;
      peVar14 = (peVar14->outer).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr) {
    poVar9 = this->out;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"| Stack Frame: ",0xf);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0);
    local_58._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_58,1);
    poVar9 = this->out;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"| | Program Counter: ",0x15);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    local_58._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_58,1);
    std::__ostream_insert<char,std::char_traits<char>>(this->out,"| | Locals:\n",0xc);
    if ((peVar14->locals).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (peVar14->locals).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar13 = 8;
      uVar11 = 0;
      do {
        poVar9 = this->out;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"| |   |",7);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"| ",2);
        pVVar1 = (peVar14->locals).
                 super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(peVar14->locals).
                          super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 4) <= uVar11)
        goto LAB_00116434;
        VVar16._4_4_ = 0;
        VVar16.type = *(uint *)((long)pVVar1 + uVar13 + -8);
        VVar16.field_1.integerValue =
             ((anon_union_8_6_52c89740_for_Variable_1 *)((long)&pVVar1->type + uVar13))->
             integerValue;
        variableToString_abi_cxx11_(&local_58,this,VVar16,false);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                                    local_58._M_dataplus._M_p._0_1_),
                            local_58._M_string_length);
        local_31 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_31,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
            &local_58.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                          local_58.field_2._M_allocated_capacity + 1);
        }
        uVar11 = uVar11 + 1;
        uVar13 = uVar13 + 0x10;
      } while (uVar11 < (ulong)((long)(peVar14->locals).
                                      super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(peVar14->locals).
                                      super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->out,"| | Captures:\n",0xe);
    if ((peVar14->function->captures).
        super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (peVar14->function->captures).
        super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      index = 0;
      do {
        poVar9 = this->out;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"| |   |",7);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"| ",2);
        VVar16 = loadClosureValue(this,peVar14->function,index);
        var._4_4_ = 0;
        var.type = VVar16.type;
        var.field_1.integerValue = VVar16.field_1.integerValue;
        variableToString_abi_cxx11_(&local_58,this,var,false);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                                    local_58._M_dataplus._M_p._0_1_),
                            local_58._M_string_length);
        local_31 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_31,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
            &local_58.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                          local_58.field_2._M_allocated_capacity + 1);
        }
        index = index + 1;
      } while (index < (ulong)((long)(peVar14->function->captures).
                                     super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(peVar14->function->captures).
                                     super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->out,"| | Op Stack:\n",0xe);
    if ((peVar14->opStack).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (peVar14->opStack).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = 8;
      uVar11 = 0;
      do {
        poVar9 = this->out;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"| |   |",7);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"| ",2);
        pVVar1 = (peVar14->opStack).
                 super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(peVar14->opStack).
                          super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 4) <= uVar11)
        goto LAB_00116434;
        var_00._4_4_ = 0;
        var_00.type = *(uint *)((long)pVVar1 + uVar13 + -8);
        var_00.field_1.integerValue =
             ((anon_union_8_6_52c89740_for_Variable_1 *)((long)&pVVar1->type + uVar13))->
             integerValue;
        variableToString_abi_cxx11_(&local_58,this,var_00,false);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                                    local_58._M_dataplus._M_p._0_1_),
                            local_58._M_string_length);
        local_31 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_31,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
            &local_58.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                          local_58.field_2._M_allocated_capacity + 1);
        }
        uVar11 = uVar11 + 1;
        uVar13 = uVar13 + 0x10;
      } while (uVar11 < (ulong)((long)(peVar14->opStack).
                                      super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(peVar14->opStack).
                                      super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->out,"| | Byte Code:\n",0xf);
    pFVar2 = peVar14->function->fn;
    if ((pFVar2->byteCode).
        super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pFVar2->byteCode).
        super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar13 = 8;
      uVar11 = 0;
      do {
        poVar9 = this->out;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"| |   |",7);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"| ",2);
        pFVar2 = peVar14->function->fn;
        pBVar3 = (pFVar2->byteCode).
                 super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if ((ulong)((long)(pFVar2->byteCode).
                          super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar3 >> 4) <= uVar11)
        goto LAB_00116434;
        bc._4_4_ = 0;
        bc.instruction = *(uint *)((long)pBVar3 + uVar13 + -8);
        bc.parameter = *(size_t *)((long)&pBVar3->instruction + uVar13);
        byteCodeToString_abi_cxx11_(&local_58,this,bc,false);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                                    local_58._M_dataplus._M_p._0_1_),
                            local_58._M_string_length);
        local_31 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_31,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
            &local_58.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                          local_58.field_2._M_allocated_capacity + 1);
        }
        pFVar2 = peVar14->function->fn;
        uVar11 = uVar11 + 1;
        uVar13 = uVar13 + 0x10;
      } while (uVar11 < (ulong)((long)(pFVar2->byteCode).
                                      super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pFVar2->byteCode).
                                      super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->out,"| \\------------------\n",0x16);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"\\------------------\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"Entrypoint:\n",0xc);
  printFunction(this,&((this->file).
                       super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->entrypoint);
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"\\------------------\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"Functions:\n",0xb);
  peVar4 = (this->file).super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if ((peVar4->functions).
      super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (peVar4->functions).
      super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar15 = 0;
    uVar11 = 0;
    do {
      poVar9 = this->out;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"| Function: ",0xc);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      local_58._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_58,1);
      peVar4 = (this->file).
               super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pFVar5 = (peVar4->functions).
               super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = uVar11;
      if ((ulong)((long)(peVar4->functions).
                        super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pFVar5 >> 6) <= uVar11)
      goto LAB_00116434;
      printFunction(this,(Function *)((long)&pFVar5->argumentCount + lVar15));
      peVar4 = (this->file).
               super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar11 = uVar11 + 1;
      lVar15 = lVar15 + 0x40;
    } while (uVar11 < (ulong)((long)(peVar4->functions).
                                    super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(peVar4->functions).
                                    super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"\\------------------\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"Object Constructors:\n",0x15);
  peVar4 = (this->file).super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if ((peVar4->objects).
      super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (peVar4->objects).
      super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar11 = 0;
    do {
      poVar9 = this->out;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"| |",3);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"| ",2);
      peVar4 = (this->file).
               super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pOVar6 = (peVar4->objects).
               super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = ((long)(peVar4->objects).
                      super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar6 >> 3) *
               -0x5555555555555555;
      uVar13 = uVar11;
      if (uVar10 < uVar11 || uVar10 - uVar11 == 0) {
LAB_00116434:
        do {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar11);
          uVar11 = uVar13;
        } while( true );
      }
      pbVar7 = *(pointer *)((long)(pOVar6 + uVar11) + 8);
      for (pbVar12 = *(pointer *)&pOVar6[uVar11].keys; pbVar12 != pbVar7; pbVar12 = pbVar12 + 1) {
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (this->out,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      }
      local_58._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(this->out,(char *)&local_58,1);
      peVar4 = (this->file).
               super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(((long)(peVar4->objects).
                                     super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(peVar4->objects).
                                     super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"\\------------------\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"Integer Constants:\n",0x13);
  printConstantArray<long>
            (this->out,
             &((this->file).
               super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->intConstants);
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"\\------------------\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"Float Constants:\n",0x11);
  printConstantArray<double>
            (this->out,
             &((this->file).
               super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->floatConstants);
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"\\------------------\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"String Constants:\n",0x12);
  printConstantArray<std::__cxx11::string>
            (this->out,
             &((this->file).
               super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->stringConstants);
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"\\------------------\n",0x14);
  cVar8 = (char)this->out;
  std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar8);
  std::ostream::put(cVar8);
  std::ostream::flush();
  return;
}

Assistant:

void runtime::VirtualMachine::print() {
  this->out << "Stack Frames:\n";

  StackFrame* stackFrame = this->stackFrame.get();

  int frameDepth = 0;

  while (stackFrame != nullptr) {
    this->out << "| Stack Frame: " << frameDepth << '\n';
    this->out << "| | Program Counter: " << stackFrame->programCounter << '\n';
    this->out << "| | Locals:\n";
    for (std::size_t i = 0; i < stackFrame->locals.size(); i++) {
      this->out << "| |   |" << i << "| " << this->variableToString(stackFrame->locals.at(i), false) << '\n';
    }
    this->out << "| | Captures:\n";
    for (std::size_t i = 0; i < stackFrame->function->captures.size(); i++) {
      this->out << "| |   |" << i << "| " << this->variableToString(this->loadClosureValue(stackFrame->function, i), false) << '\n';
    }
    this->out << "| | Op Stack:\n";
    for (std::size_t i = 0; i < stackFrame->opStack.size(); i++) {
      this->out << "| |   |" << i << "| " << this->variableToString(stackFrame->opStack.at(i), false) << '\n';
    }
    this->out << "| | Byte Code:\n";
    for (std::size_t i = 0; i < stackFrame->function->fn->byteCode.size(); i++) {
      this->out << "| |   |" << i << "| " << this->byteCodeToString(stackFrame->function->fn->byteCode.at(i), false) << '\n';
    }
    this->out << "| \\------------------\n";

    stackFrame = stackFrame->outer.get();
  }
  this->out << "\\------------------\n";

  this->out << "Entrypoint:\n";
  this->printFunction(&this->file->entrypoint);
  this->out << "\\------------------\n";

  this->out << "Functions:\n";
  for (std::size_t i = 0; i < this->file->functions.size(); i++) {
    this->out << "| Function: " << i << '\n';
    this->printFunction(&this->file->functions.at(i));
  }
  this->out << "\\------------------\n";

  this->out << "Object Constructors:\n";
  for (std::size_t i = 0; i < this->file->objects.size(); i++) {
    this->out << "| |" << i << "| ";
    const auto& obj = this->file->objects.at(i);
    for (const auto& key : obj.keys) {
      this->out << key << ", ";
    }
    this->out << '\n';
  }
  this->out << "\\------------------\n";

  this->out << "Integer Constants:\n";
  printConstantArray<std::int64_t>(this->out, this->file->intConstants);
  this->out << "\\------------------\n";

  this->out << "Float Constants:\n";
  printConstantArray<double>(this->out, this->file->floatConstants);
  this->out << "\\------------------\n";

  this->out << "String Constants:\n";
  printConstantArray<std::string>(this->out, this->file->stringConstants);
  this->out << "\\------------------\n";

  this->out << std::endl;
}